

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O1

void GmmDestroyMultiAdapterContext(void)

{
  GMM_MA_LIB_CONTEXT *__ptr;
  
  __ptr = pGmmMALibContext;
  if ((pGmmMALibContext != (GMM_MA_LIB_CONTEXT *)0x0) && (pGmmMALibContext->NumAdapters == 0)) {
    pthread_mutex_destroy((pthread_mutex_t *)&pGmmMALibContext->MAContextSyncMutex);
    free(__ptr);
    pGmmMALibContext = (GMM_MA_LIB_CONTEXT *)0x0;
  }
  return;
}

Assistant:

GMM_LIB_API_DESTRUCTOR void GmmDestroyMultiAdapterContext()
{
    if(pGmmMALibContext)
    {
        // Before destroying GmmMultiAdapterContext, check if all the Adapters have
        // their GmmLibContext destroyed.
        // At this point the linked list is empty and pHeadNode = NULL & NumAdapter=0.
	if(!pGmmMALibContext->GetNumAdapters())
        {
            delete pGmmMALibContext;
            pGmmMALibContext = NULL;
        }
    }
}